

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O1

bool absl::lts_20250127::base_internal::LowLevelAlloc::DeleteArena(Arena *arena)

{
  int iVar1;
  size_t __len;
  AllocList *__addr;
  int iVar2;
  long lVar3;
  uint *puVar4;
  Arena *unaff_RBX;
  ArenaLock section;
  ArenaLock local_a0;
  
  if (arena == (Arena *)0x0) goto LAB_002d2303;
  if ((anonymous_namespace)::create_globals_once != 0xdd) goto LAB_002d2308;
  do {
    unaff_RBX = arena;
    if (arena != (Arena *)(anonymous_namespace)::default_arena_storage) {
      if ((anonymous_namespace)::create_globals_once != 0xdd) {
        DeleteArena();
      }
      if (arena != (Arena *)(anonymous_namespace)::unhooked_arena_storage) {
        anon_unknown_0::ArenaLock::ArenaLock(&local_a0,arena);
        iVar1 = arena->allocation_count;
        if (iVar1 != 0) {
          anon_unknown_0::ArenaLock::Leave(&local_a0);
LAB_002d2220:
          anon_unknown_0::ArenaLock::~ArenaLock(&local_a0);
          return iVar1 == 0;
        }
        while( true ) {
          __addr = (arena->freelist).next[0];
          if (__addr == (AllocList *)0x0) {
            anon_unknown_0::ArenaLock::Leave(&local_a0);
            Free(arena);
            goto LAB_002d2220;
          }
          __len = (__addr->header).size;
          (arena->freelist).next[0] = __addr->next[0];
          if (((__addr->header).magic ^ (ulong)__addr) != 0xffffffffb37cc16a) break;
          if ((__addr->header).arena != arena) goto LAB_002d226d;
          if (__len % arena->pagesize != 0) goto LAB_002d229f;
          if ((ulong)__addr % arena->pagesize != 0) goto LAB_002d22d1;
          if ((arena->flags & 2) == 0) {
            iVar2 = munmap(__addr,__len);
          }
          else {
            lVar3 = syscall(0xb,__addr,__len);
            iVar2 = (int)lVar3;
          }
          if (iVar2 != 0) {
            puVar4 = (uint *)__errno_location();
            raw_log_internal::RawLog
                      (kFatal,"low_level_alloc.cc",0x1a5,
                       "LowLevelAlloc::DeleteArena: munmap failed: %d",(ulong)*puVar4);
            __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                          ,0x1a5,
                          "static bool absl::base_internal::LowLevelAlloc::DeleteArena(Arena *)");
          }
        }
        raw_log_internal::RawLog
                  (kFatal,"low_level_alloc.cc",0x18d,"Check %s failed: %s",
                   "region->header.magic == Magic(kMagicUnallocated, &region->header)",
                   "bad magic number in DeleteArena()");
        DeleteArena();
LAB_002d226d:
        raw_log_internal::RawLog
                  (kFatal,"low_level_alloc.cc",399,"Check %s failed: %s",
                   "region->header.arena == arena","bad arena pointer in DeleteArena()");
        DeleteArena();
LAB_002d229f:
        raw_log_internal::RawLog
                  (kFatal,"low_level_alloc.cc",0x191,"Check %s failed: %s",
                   "size % arena->pagesize == 0","empty arena has non-page-aligned block size");
        DeleteArena();
LAB_002d22d1:
        raw_log_internal::RawLog
                  (kFatal,"low_level_alloc.cc",0x193,"Check %s failed: %s",
                   "reinterpret_cast<uintptr_t>(region) % arena->pagesize == 0",
                   "empty arena has non-page-aligned block");
        DeleteArena();
      }
    }
LAB_002d2303:
    arena = unaff_RBX;
    DeleteArena();
LAB_002d2308:
    DeleteArena();
  } while( true );
}

Assistant:

bool LowLevelAlloc::DeleteArena(Arena *arena) {
  ABSL_RAW_CHECK(
      arena != nullptr && arena != DefaultArena() && arena != UnhookedArena(),
      "may not delete default arena");
  ArenaLock section(arena);
  if (arena->allocation_count != 0) {
    section.Leave();
    return false;
  }
  while (arena->freelist.next[0] != nullptr) {
    AllocList *region = arena->freelist.next[0];
    size_t size = region->header.size;
    arena->freelist.next[0] = region->next[0];
    ABSL_RAW_CHECK(
        region->header.magic == Magic(kMagicUnallocated, &region->header),
        "bad magic number in DeleteArena()");
    ABSL_RAW_CHECK(region->header.arena == arena,
                   "bad arena pointer in DeleteArena()");
    ABSL_RAW_CHECK(size % arena->pagesize == 0,
                   "empty arena has non-page-aligned block size");
    ABSL_RAW_CHECK(reinterpret_cast<uintptr_t>(region) % arena->pagesize == 0,
                   "empty arena has non-page-aligned block");
    int munmap_result;
#ifdef _WIN32
    munmap_result = VirtualFree(region, 0, MEM_RELEASE);
    ABSL_RAW_CHECK(munmap_result != 0,
                   "LowLevelAlloc::DeleteArena: VitualFree failed");
#else
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
    if ((arena->flags & LowLevelAlloc::kAsyncSignalSafe) == 0) {
      munmap_result = munmap(region, size);
    } else {
      munmap_result = base_internal::DirectMunmap(region, size);
    }
#else
    munmap_result = munmap(region, size);
#endif  // ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
    if (munmap_result != 0) {
      ABSL_RAW_LOG(FATAL, "LowLevelAlloc::DeleteArena: munmap failed: %d",
                   errno);
    }
#endif  // _WIN32
  }
  section.Leave();
  arena->~Arena();
  Free(arena);
  return true;
}